

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Op.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::UnionOp::UnionOp(UnionOp *this,opType type,XMLSize_t size,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::Op> *this_00;
  MemoryManager *manager_local;
  XMLSize_t size_local;
  opType type_local;
  UnionOp *this_local;
  
  Op::Op(&this->super_Op,type,manager);
  (this->super_Op)._vptr_Op = (_func_int **)&PTR__UnionOp_00525320;
  this_00 = (RefVectorOf<xercesc_4_0::Op> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::Op>::RefVectorOf(this_00,size,false,manager);
  this->fBranches = this_00;
  return;
}

Assistant:

UnionOp::UnionOp(const Op::opType type, const XMLSize_t size, MemoryManager* const manager)
    : Op(type, manager)
      , fBranches(new (manager) RefVectorOf<Op> (size, false, manager)) {

}